

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<std::complex<float>,_10>::Shrink(TPZManVector<std::complex<float>,_10> *this)

{
  complex<float> *pcVar1;
  ulong uVar2;
  complex<float> *pcVar3;
  ulong uVar4;
  int64_t i;
  
  uVar4 = (this->super_TPZVec<std::complex<float>_>).fNElements;
  if ((long)uVar4 < 0xb) {
    pcVar3 = (this->super_TPZVec<std::complex<float>_>).fStore;
    pcVar1 = this->fExtAlloc;
    if (pcVar3 != pcVar1) {
      uVar2 = 0;
      if ((long)uVar4 < 1) {
        uVar4 = uVar2;
      }
      for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
        pcVar1[uVar2]._M_value = pcVar3[uVar2]._M_value;
      }
      if (pcVar3 != (complex<float> *)0x0) {
        operator_delete__(pcVar3);
      }
      (this->super_TPZVec<std::complex<float>_>).fStore = pcVar1;
      (this->super_TPZVec<std::complex<float>_>).fNAlloc = 10;
    }
  }
  else if ((this->super_TPZVec<std::complex<float>_>).fNAlloc != uVar4) {
    pcVar3 = (complex<float> *)operator_new__(-(ulong)(uVar4 >> 0x3d != 0) | uVar4 * 8);
    memset(pcVar3,0,uVar4 * 8);
    pcVar1 = (this->super_TPZVec<std::complex<float>_>).fStore;
    for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      pcVar3[uVar2]._M_value = pcVar1[uVar2]._M_value;
    }
    if (pcVar1 != (complex<float> *)0x0) {
      operator_delete__(pcVar1);
      uVar4 = (this->super_TPZVec<std::complex<float>_>).fNElements;
    }
    (this->super_TPZVec<std::complex<float>_>).fStore = pcVar3;
    (this->super_TPZVec<std::complex<float>_>).fNAlloc = uVar4;
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Shrink() {
    // Philippe : Porque NumExtAlloc <= this->fNAlloc????
    //    if(this->fNElements <= NumExtAlloc && NumExtAlloc <= this->fNAlloc) {
    if (this->fNElements <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0; i < this->fNElements; i++)
                fExtAlloc[i] = this->fStore[i];

            if (this->fStore)
                delete [] this->fStore;

            this->fStore = fExtAlloc;
            this->fNAlloc = NumExtAlloc;
        }
    } else if (this->fNAlloc != this->fNElements) { // then  fExtAlloc != this->fStore  because  NumExtAlloc != this->fNAlloc
        // Philippe : Memoria alocada externamente nao pode ser deletada
        //          if(fExtAlloc) delete[] fExtAlloc;
        T *newstore = 0;

        if (this->fNElements)
            newstore = new T[this->fNElements];

        for (int64_t i = 0; i < this->fNElements; i++)
            newstore[i] = this->fStore[i];

        if (this->fStore)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNAlloc = this->fNElements;

        // Philippe Isto eh um absurdo
        //          fExtAlloc = this->fStore;
        //          NumExtAlloc = this->fNAlloc;
    }
}